

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O1

bool __thiscall
re2::PCRE::Rewrite(PCRE *this,string *out,StringPiece *rewrite,StringPiece *text,int *vec,int veclen
                  )

{
  uint uVar1;
  char *pcVar2;
  bool bVar3;
  ostream *poVar4;
  size_t sVar5;
  long lVar6;
  char *pcVar7;
  bool bVar8;
  char *pcVar9;
  LogMessage local_1b0;
  
  lVar6 = (long)rewrite->length_;
  bVar8 = lVar6 < 1;
  if (0 < lVar6) {
    pcVar9 = rewrite->ptr_;
    pcVar7 = pcVar9 + lVar6;
    do {
      if (*pcVar9 == '\\') {
        pcVar2 = pcVar9 + 1;
        pcVar9 = pcVar9 + 1;
        uVar1 = (int)*pcVar2 - 0x30;
        if (uVar1 < 10) {
          if ((int)uVar1 < veclen) {
            bVar3 = true;
            if (-1 < (long)vec[uVar1 * 2]) {
              std::__cxx11::string::append((char *)out,(ulong)(text->ptr_ + vec[uVar1 * 2]));
            }
            goto LAB_00120a35;
          }
          LogMessage::LogMessage
                    (&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/pcre.cc"
                     ,0x293,2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0.str_,"requested group ",0x10);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&local_1b0.str_,uVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," in regexp ",0xb);
          pcVar2 = rewrite->ptr_;
          if (pcVar2 == (char *)0x0) {
            std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
          }
          else {
            sVar5 = strlen(pcVar2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar2,sVar5);
          }
        }
        else {
          if (*pcVar2 == '\\') goto LAB_001208f6;
          LogMessage::LogMessage
                    (&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/pcre.cc"
                     ,0x29e,2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0.str_,"invalid rewrite pattern: ",0x19);
          pcVar2 = rewrite->ptr_;
          if (pcVar2 == (char *)0x0) {
            std::ios::clear((int)&local_1b0 + 8 + (int)*(undefined8 *)(local_1b0._8_8_ + -0x18));
          }
          else {
            sVar5 = strlen(pcVar2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1b0.str_,pcVar2,sVar5);
          }
        }
        LogMessage::~LogMessage(&local_1b0);
        bVar3 = false;
      }
      else {
LAB_001208f6:
        std::__cxx11::string::push_back((char)out);
        bVar3 = true;
      }
LAB_00120a35:
      if (!bVar3) {
        return bVar8;
      }
      pcVar9 = pcVar9 + 1;
      bVar8 = pcVar9 >= pcVar7;
    } while (pcVar9 < pcVar7);
  }
  return bVar8;
}

Assistant:

bool PCRE::Rewrite(string *out, const StringPiece &rewrite,
                 const StringPiece &text, int *vec, int veclen) const {
  int number_of_capturing_groups = NumberOfCapturingGroups();
  for (const char *s = rewrite.data(), *end = s + rewrite.size();
       s < end; s++) {
    int c = *s;
    if (c == '\\') {
      c = *++s;
      if (isdigit(c)) {
        int n = (c - '0');
        if (n >= veclen) {
          if (n <= number_of_capturing_groups) {
            // unmatched optional capturing group. treat
            // its value as empty string; i.e., nothing to append.
          } else {
            PCREPORT(ERROR) << "requested group " << n
                          << " in regexp " << rewrite.data();
            return false;
          }
        }
        int start = vec[2 * n];
        if (start >= 0)
          out->append(text.data() + start, vec[2 * n + 1] - start);
      } else if (c == '\\') {
        out->push_back('\\');
      } else {
        PCREPORT(ERROR) << "invalid rewrite pattern: " << rewrite.data();
        return false;
      }
    } else {
      out->push_back(c);
    }
  }
  return true;
}